

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_BucketCount_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::~HashtableAllTest_BucketCount_Test
          (HashtableAllTest_BucketCount_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  void *in_RDI;
  
  ~HashtableAllTest_BucketCount_Test
            ((HashtableAllTest_BucketCount_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)0xc71748);
  operator_delete(in_RDI);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, BucketCount) {
  TypeParam ht(100);
  // constructor arg is number of *items* to be inserted, not the
  // number of buckets, so we expect more buckets.
  EXPECT_GT(ht.bucket_count(), 100u);
  for (int i = 1; i < 200; i++) {
    ht.insert(this->UniqueObject(i));
  }
  EXPECT_GT(ht.bucket_count(), 200u);
}